

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cnfUtil.c
# Opt level: O2

int Cnf_ManScanMapping_rec(Cnf_Man_t *p,Aig_Obj_t *pObj,Vec_Ptr_t *vMapped,int fPreorder)

{
  char *pcVar1;
  int iVar2;
  ulong uVar3;
  Aig_Obj_t *pObj_00;
  Vec_Ptr_t *vSuper;
  void *pvVar4;
  int i;
  int iVar5;
  long lVar6;
  
  uVar3 = *(ulong *)&pObj->field_0x18;
  *(ulong *)&pObj->field_0x18 =
       uVar3 & 0xffffffff0000003f | (ulong)((uint)uVar3 + 0x40 & 0xffffffc0);
  iVar5 = 0;
  if ((((uint)uVar3 & 7) != 2 && (uVar3 & 0xffffffc0) == 0) &&
     (iVar2 = Aig_ObjIsConst1(pObj), iVar5 = 0, iVar2 == 0)) {
    uVar3 = *(ulong *)&pObj->field_0x18;
    if (((uint)uVar3 & 7) != 5) {
      __assert_fail("Aig_ObjIsAnd(pObj)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/cnf/cnfUtil.c"
                    ,0x7f,"int Cnf_ManScanMapping_rec(Cnf_Man_t *, Aig_Obj_t *, Vec_Ptr_t *, int)");
    }
    if ((pObj->field_5).pData == (void *)0x0) {
      __assert_fail("pObj->pData != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/cnf/cnfUtil.c"
                    ,0x80,"int Cnf_ManScanMapping_rec(Cnf_Man_t *, Aig_Obj_t *, Vec_Ptr_t *, int)");
    }
    if (fPreorder != 0 && vMapped != (Vec_Ptr_t *)0x0) {
      Vec_PtrPush(vMapped,pObj);
      uVar3 = *(ulong *)&pObj->field_0x18;
    }
    if ((uVar3 & 0x20) == 0) {
      pcVar1 = (char *)(pObj->field_5).pData;
      iVar5 = (int)pcVar1[1];
      if (iVar5 == 0x7f) {
        __assert_fail("pCutBest->Cost < 127",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/cnf/cnfUtil.c"
                      ,0x94,"int Cnf_ManScanMapping_rec(Cnf_Man_t *, Aig_Obj_t *, Vec_Ptr_t *, int)"
                     );
      }
      lVar6 = 0;
      while ((lVar6 < *pcVar1 &&
             (pObj_00 = Aig_ManObj(p->pManAig,*(int *)(pcVar1 + lVar6 * 4 + 0x18)),
             pObj_00 != (Aig_Obj_t *)0x0))) {
        iVar2 = Cnf_ManScanMapping_rec(p,pObj_00,vMapped,fPreorder);
        iVar5 = iVar5 + iVar2;
        lVar6 = lVar6 + 1;
      }
    }
    else {
      vSuper = Vec_PtrAlloc(100);
      Aig_ObjCollectSuper(pObj,vSuper);
      iVar2 = vSuper->nSize;
      iVar5 = iVar2 + 1;
      for (i = 0; i < iVar2; i = i + 1) {
        pvVar4 = Vec_PtrEntry(vSuper,i);
        iVar2 = Cnf_ManScanMapping_rec
                          (p,(Aig_Obj_t *)((ulong)pvVar4 & 0xfffffffffffffffe),vMapped,fPreorder);
        iVar5 = iVar5 + iVar2;
        iVar2 = vSuper->nSize;
      }
      Vec_PtrFree(vSuper);
      pObj->field_0x18 = pObj->field_0x18 | 0x20;
    }
    if (vMapped != (Vec_Ptr_t *)0x0 && fPreorder == 0) {
      Vec_PtrPush(vMapped,pObj);
    }
  }
  return iVar5;
}

Assistant:

int Cnf_ManScanMapping_rec( Cnf_Man_t * p, Aig_Obj_t * pObj, Vec_Ptr_t * vMapped, int fPreorder )
{
    Aig_Obj_t * pLeaf;
    Cnf_Cut_t * pCutBest;
    int aArea, i;
    if ( pObj->nRefs++ || Aig_ObjIsCi(pObj) || Aig_ObjIsConst1(pObj) )
        return 0;
    assert( Aig_ObjIsAnd(pObj) );
    assert( pObj->pData != NULL );
    // add the node to the mapping
    if ( vMapped && fPreorder )
         Vec_PtrPush( vMapped, pObj );
    // visit the transitive fanin of the selected cut
    if ( pObj->fMarkB )
    {
        Vec_Ptr_t * vSuper = Vec_PtrAlloc( 100 );
        Aig_ObjCollectSuper( pObj, vSuper );
        aArea = Vec_PtrSize(vSuper) + 1;
        Vec_PtrForEachEntry( Aig_Obj_t *, vSuper, pLeaf, i )
            aArea += Cnf_ManScanMapping_rec( p, Aig_Regular(pLeaf), vMapped, fPreorder );
        Vec_PtrFree( vSuper );
        ////////////////////////////
        pObj->fMarkB = 1;
    }
    else
    {
        pCutBest = (Cnf_Cut_t *)pObj->pData;
//        assert( pCutBest->nFanins > 0 );
        assert( pCutBest->Cost < 127 );
        aArea = pCutBest->Cost;
        Cnf_CutForEachLeaf( p->pManAig, pCutBest, pLeaf, i )
            aArea += Cnf_ManScanMapping_rec( p, pLeaf, vMapped, fPreorder );
    }
    // add the node to the mapping
    if ( vMapped && !fPreorder )
         Vec_PtrPush( vMapped, pObj );
    return aArea;
}